

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  Type TVar2;
  uint32 value;
  UnknownField *this;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int field_size;
  UnknownField *field;
  size_t sStack_18;
  int i;
  size_t size;
  UnknownFieldSet *unknown_fields_local;
  
  sStack_18 = 0;
  field._4_4_ = 0;
  while( true ) {
    iVar1 = UnknownFieldSet::field_count(unknown_fields);
    if (iVar1 <= field._4_4_) break;
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    TVar2 = UnknownField::type(this);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      value = UnknownField::number(this);
      sVar3 = io::CodedOutputStream::VarintSize32(value);
      sVar4 = UnknownField::GetLengthDelimitedSize(this);
      sVar5 = io::CodedOutputStream::VarintSize32((uint32)sVar4);
      sStack_18 = (long)(int)(uint32)sVar4 + sVar5 + sVar3 + sStack_18 + 4;
    }
    field._4_4_ = field._4_4_ + 1;
  }
  return sStack_18;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}